

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_uncompress2mem(char *filename,FILE *diskfile,int hdl)

{
  char *pcVar1;
  int status;
  size_t finalsize;
  int local_34;
  size_t local_30;
  
  local_34 = 0;
  pcVar1 = strstr(filename,".Z");
  if (pcVar1 == (char *)0x0) {
    uncompress2mem(filename,diskfile,memTable[hdl].memaddrptr,memTable[hdl].memsizeptr,realloc,
                   &local_30,&local_34);
  }
  else {
    zuncompress2mem(filename,diskfile,memTable[hdl].memaddrptr,memTable[hdl].memsizeptr,realloc,
                    &local_30,&local_34);
  }
  memTable[hdl].currentpos = 0;
  memTable[hdl].fitsfilesize = local_30;
  return local_34;
}

Assistant:

int mem_uncompress2mem(char *filename, FILE *diskfile, int hdl)
{
/*
  lower level routine to uncompress a file into memory.  The file
  has already been opened and the memory buffer has been allocated.
*/

  size_t finalsize;
  int status;
  /* uncompress file into memory */
  status = 0;

    if (strstr(filename, ".Z")) {
         zuncompress2mem(filename, diskfile,
		 memTable[hdl].memaddrptr,   /* pointer to memory address */
		 memTable[hdl].memsizeptr,   /* pointer to size of memory */
		 realloc,                     /* reallocation function */
		 &finalsize, &status);        /* returned file size nd status*/
#if HAVE_BZIP2
    } else if (strstr(filename, ".bz2")) {
        bzip2uncompress2mem(filename, diskfile, hdl, &finalsize, &status);
#endif
    } else {
         uncompress2mem(filename, diskfile,
		 memTable[hdl].memaddrptr,   /* pointer to memory address */
		 memTable[hdl].memsizeptr,   /* pointer to size of memory */
		 realloc,                     /* reallocation function */
		 &finalsize, &status);        /* returned file size nd status*/
    } 

  memTable[hdl].currentpos = 0;           /* save starting position */
  memTable[hdl].fitsfilesize=finalsize;   /* and initial file size  */
  return status;
}